

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueBigInt16::write(PLYValueBigInt16 *this,int __fd,void *__buf,size_t __n)

{
  undefined1 *puVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  if ((undefined1 *)plVar3[5] < (undefined1 *)plVar3[6]) {
    *(undefined1 *)plVar3[5] = (char)((ulong)__buf >> 8);
    plVar3[5] = plVar3[5] + 1;
  }
  else {
    (**(code **)(*plVar3 + 0x68))(plVar3,(ulong)__buf >> 8 & 0xff);
  }
  puVar1 = (undefined1 *)plVar3[5];
  if (puVar1 < (undefined1 *)plVar3[6]) {
    *puVar1 = (char)__buf;
    plVar3[5] = plVar3[5] + 1;
    return (ssize_t)puVar1;
  }
  sVar2 = (**(code **)(*plVar3 + 0x68))(plVar3,(ulong)__buf & 0xff);
  return sVar2;
}

Assistant:

void write(std::streambuf *out, int v)
    {
      out->sputc(static_cast<char>((v>>8)&0xff));
      out->sputc(static_cast<char>(v&0xff));
    }